

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re_search.c
# Opt level: O2

int re_repl(int f,int n)

{
  int iVar1;
  char *pcVar2;
  uint uVar3;
  char local_68 [8];
  char news [80];
  
  iVar1 = re_readpattern("RE Replace");
  if (iVar1 == 1) {
    uVar3 = 0;
    pcVar2 = eread("Replace %s with: ",local_68,0x50,0x58,re_pat);
    if (pcVar2 == (char *)0x0) {
      iVar1 = 2;
    }
    else {
      while (iVar1 = re_forwsrch(), iVar1 != 0) {
        iVar1 = re_doreplace(regex_match[0].rm_eo - regex_match[0].rm_so,local_68);
        if (iVar1 == 0) {
          return 0;
        }
        uVar3 = uVar3 + 1;
      }
      curwp->w_rflag = curwp->w_rflag | 8;
      update(2);
      iVar1 = 1;
      if (inmacro == 0) {
        ewprintf("(%d replacement(s) done)",(ulong)uVar3);
      }
    }
  }
  return iVar1;
}

Assistant:

int
re_repl(int f, int n)
{
	int     rcnt = 0;		/* replacements made so far     */
	int     plen, s;		/* length of found string       */
	char    news[NPAT];		/* replacement string           */

	if ((s = re_readpattern("RE Replace")) != TRUE)
		return (s);
	if (eread("Replace %s with: ", news, NPAT,
	    EFNUL | EFNEW | EFCR, re_pat) == NULL)
                return (ABORT);

	while (re_forwsrch() == TRUE) {
		plen = regex_match[0].rm_eo - regex_match[0].rm_so;
		if (re_doreplace((RSIZE)plen, news) == FALSE)
			return (FALSE);
		rcnt++;
	}

	curwp->w_rflag |= WFFULL;
	update(CMODE);
	if (!inmacro)
		ewprintf("(%d replacement(s) done)", rcnt);
	
	return(TRUE);
}